

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemComboBox.cpp
# Opt level: O2

void QFileSystemComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *nameFilters;
  QArrayDataPointer<QString> *this;
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  qsizetype qVar5;
  Data *pDVar6;
  QString *pQVar7;
  bool bVar8;
  Filters FVar9;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      directoryLoaded((QFileSystemComboBox *)_o,(QString *)_a[1]);
      return;
    case 1:
      rootPathChanged((QFileSystemComboBox *)_o,(QString *)_a[1]);
      return;
    case 2:
      currentFileNameChanged((QString *)&local_28,(QFileSystemComboBox *)_o,(QString *)_a[1]);
      break;
    case 3:
      currentFilePathChanged((QString *)&local_28,(QFileSystemComboBox *)_o,(QString *)_a[1]);
      break;
    default:
      goto switchD_00182b56_caseD_3;
    }
    puVar4 = (undefined8 *)*_a;
    if (puVar4 != (undefined8 *)0x0) {
      pDVar6 = (Data *)*puVar4;
      pQVar7 = (QString *)puVar4[1];
      *puVar4 = local_28.d;
      puVar4[1] = local_28.ptr;
      qVar5 = puVar4[2];
      puVar4[2] = local_28.size;
      local_28.d = pDVar6;
      local_28.ptr = pQVar7;
      local_28.size = qVar5;
    }
    goto LAB_00182dcf;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    this = (QArrayDataPointer<QString> *)*_a;
    switch(_id) {
    case 0:
      bVar8 = nameFilterDisables((QFileSystemComboBox *)_o);
      goto LAB_00182d85;
    case 1:
      bVar8 = resolveSymlinks((QFileSystemComboBox *)_o);
LAB_00182d85:
      *(bool *)&this->d = bVar8;
      return;
    case 2:
      FVar9 = filters((QFileSystemComboBox *)_o);
      goto LAB_00182d25;
    case 3:
      QFileSystemComboBox::nameFilters((QStringList *)&local_28,(QFileSystemComboBox *)_o);
      QArrayDataPointer<QString>::operator=(this,&local_28);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 4:
      FVar9.i = visibleSection((QFileSystemComboBox *)_o);
LAB_00182d25:
      *(Int *)&this->d = FVar9.i;
      return;
    case 5:
      rootPath((QString *)&local_28,(QFileSystemComboBox *)_o);
      break;
    case 6:
      currentFileName((QString *)&local_28,(QFileSystemComboBox *)_o);
      break;
    case 7:
      currentFilePath((QString *)&local_28,(QFileSystemComboBox *)_o);
    }
    pDVar6 = this->d;
    pQVar7 = this->ptr;
    this->d = local_28.d;
    this->ptr = local_28.ptr;
    qVar5 = this->size;
    this->size = local_28.size;
    local_28.d = pDVar6;
    local_28.ptr = pQVar7;
    local_28.size = qVar5;
LAB_00182dcf:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_28);
    break;
  case WriteProperty:
    if ((uint)_id < 8) {
      nameFilters = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setNameFilterDisables((QFileSystemComboBox *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 1:
        setResolveSymlinks((QFileSystemComboBox *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 2:
        setFilters((QFileSystemComboBox *)_o,(Filters)*(Int *)&(nameFilters->d).d);
        return;
      case 3:
        setNameFilters((QFileSystemComboBox *)_o,nameFilters);
        return;
      case 4:
        setVisibleSection((QFileSystemComboBox *)_o,*(Section *)&(nameFilters->d).d);
        return;
      case 5:
        setRootPath((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      case 6:
        setCurrentFileName((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      case 7:
        setCurrentFilePath((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == directoryLoaded && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == rootPathChanged && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == currentFileNameChanged && lVar3 == 0) {
      *puVar1 = 2;
    }
    else if (pcVar2 == currentFilePathChanged && lVar3 == 0) {
      *puVar1 = 3;
    }
  }
switchD_00182b56_caseD_3:
  return;
}

Assistant:

void QFileSystemComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: { QString _r = _t->currentFileNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        case 3: { QString _r = _t->currentFilePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::rootPathChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFileNameChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFilePathChanged)) {
                *result = 3;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 2: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 4: *reinterpret_cast< QFileSystemComboBox::Section*>(_v) = _t->visibleSection(); break;
        case 5: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        case 6: *reinterpret_cast< QString*>(_v) = _t->currentFileName(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->currentFilePath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 3: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setVisibleSection(*reinterpret_cast< QFileSystemComboBox::Section*>(_v)); break;
        case 5: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        case 6: _t->setCurrentFileName(*reinterpret_cast< QString*>(_v)); break;
        case 7: _t->setCurrentFilePath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}